

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O0

bool double_conversion::FastFixedDtoa
               (double v,int fractional_count,Vector<char> buffer,int *length,int *decimal_point)

{
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> buffer_03;
  Vector<char> buffer_04;
  Vector<char> buffer_05;
  Vector<char> buffer_06;
  Vector<char> buffer_07;
  int iVar1;
  undefined4 uVar2;
  ulong number;
  ulong uVar3;
  char *pcVar4;
  byte bVar5;
  int *in_RCX;
  long lVar6;
  int in_EDI;
  int *in_R8;
  long in_FS_OFFSET;
  undefined8 in_XMM0_Qa;
  uint64_t fractionals;
  uint64_t integrals;
  uint64_t remainder;
  uint32_t quotient;
  uint64_t dividend;
  int divisor_power;
  uint64_t divisor;
  uint64_t kFive17;
  int exponent;
  uint64_t significand;
  uint32_t kMaxUInt32;
  double in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  Double *in_stack_fffffffffffffed8;
  int *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  uint32_t in_stack_fffffffffffffeec;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  uint64_t in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  bool bVar7;
  Vector<char> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Double::Double((Double *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffec8);
  number = Double::Significand(in_stack_fffffffffffffed8);
  Double::Double((Double *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffec8);
  iVar1 = Double::Exponent(in_stack_fffffffffffffed8);
  if (iVar1 < 0x15) {
    if (in_EDI < 0x15) {
      *in_RCX = 0;
      bVar5 = (byte)iVar1;
      if (iVar1 + 0x35 < 0x41) {
        if (iVar1 < 0) {
          if (iVar1 < -0x34) {
            if (iVar1 < -0x80) {
              pcVar4 = Vector<char>::operator[](&local_18,0);
              *pcVar4 = '\0';
              *in_RCX = 0;
              *in_R8 = -in_EDI;
            }
            else {
              *in_R8 = 0;
              buffer_05._8_8_ = in_RCX;
              buffer_05.start_ = (char *)in_R8;
              FillFractionals(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                              in_stack_fffffffffffffef0,buffer_05,
                              (int *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                              (int *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
            }
          }
          else {
            in_stack_fffffffffffffee0 = (int *)(number >> (-bVar5 & 0x3f));
            in_stack_fffffffffffffed8 =
                 (Double *)(number - ((long)in_stack_fffffffffffffee0 << (-bVar5 & 0x3f)));
            if (in_stack_fffffffffffffee0 < (int *)0x100000000) {
              buffer_02.start_._4_4_ = in_stack_fffffffffffffef4;
              buffer_02.start_._0_4_ = in_stack_fffffffffffffef0;
              buffer_02._8_8_ = in_stack_fffffffffffffef8;
              FillDigits32(in_stack_fffffffffffffeec,buffer_02,in_stack_fffffffffffffee0);
            }
            else {
              buffer_07.start_._4_4_ = in_EDI;
              buffer_07.start_._0_4_ = in_stack_ffffffffffffff40;
              buffer_07._8_8_ = in_XMM0_Qa;
              FillDigits64((uint64_t)in_stack_fffffffffffffed8,buffer_07,
                           (int *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
            }
            *in_R8 = *in_RCX;
            buffer_04._8_8_ = in_RCX;
            buffer_04.start_ = (char *)in_R8;
            FillFractionals(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                            in_stack_fffffffffffffef0,buffer_04,
                            (int *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                            (int *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
          }
        }
        else {
          buffer_06.start_._4_4_ = in_EDI;
          buffer_06.start_._0_4_ = in_stack_ffffffffffffff40;
          buffer_06._8_8_ = in_XMM0_Qa;
          FillDigits64((uint64_t)in_stack_fffffffffffffed8,buffer_06,
                       (int *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
          *in_R8 = *in_RCX;
        }
      }
      else {
        if (iVar1 < 0x12) {
          uVar3 = 0xb1a2bc2ec5 << (0x11 - bVar5 & 0x3f);
          uVar2 = (undefined4)(number / uVar3);
          lVar6 = number % uVar3 << (bVar5 & 0x3f);
          in_stack_fffffffffffffee8 = (undefined4)lVar6;
          in_stack_fffffffffffffeec = (uint32_t)((ulong)lVar6 >> 0x20);
        }
        else {
          number = number << (bVar5 - 0x11 & 0x3f);
          uVar2 = (undefined4)(number / 0xb1a2bc2ec5);
          lVar6 = number % 0xb1a2bc2ec5 << 0x11;
          in_stack_fffffffffffffee8 = (undefined4)lVar6;
          in_stack_fffffffffffffeec = (uint32_t)((ulong)lVar6 >> 0x20);
        }
        buffer_01.start_._4_4_ = uVar2;
        buffer_01.start_._0_4_ = in_stack_fffffffffffffef0;
        buffer_01._8_8_ = number;
        FillDigits32(in_stack_fffffffffffffeec,buffer_01,in_stack_fffffffffffffee0);
        buffer_03._8_8_ = in_RCX;
        buffer_03.start_ = (char *)in_R8;
        FillDigits64FixedLength(number,buffer_03,(int *)CONCAT44(uVar2,in_stack_fffffffffffffef0));
        *in_R8 = *in_RCX;
      }
      buffer_00.length_ = in_stack_fffffffffffffee8;
      buffer_00.start_ = (char *)in_stack_fffffffffffffee0;
      buffer_00._12_4_ = in_stack_fffffffffffffeec;
      TrimZeros(buffer_00,(int *)in_stack_fffffffffffffed8,
                (int *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
      pcVar4 = Vector<char>::operator[](&local_18,*in_RCX);
      *pcVar4 = '\0';
      if (*in_RCX == 0) {
        *in_R8 = -in_EDI;
      }
      bVar7 = true;
    }
    else {
      bVar7 = false;
    }
  }
  else {
    bVar7 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool FastFixedDtoa(double v,
                   int fractional_count,
                   Vector<char> buffer,
                   int* length,
                   int* decimal_point) {
  const uint32_t kMaxUInt32 = 0xFFFFFFFF;
  uint64_t significand = Double(v).Significand();
  int exponent = Double(v).Exponent();
  // v = significand * 2^exponent (with significand a 53bit integer).
  // If the exponent is larger than 20 (i.e. we may have a 73bit number) then we
  // don't know how to compute the representation. 2^73 ~= 9.5*10^21.
  // If necessary this limit could probably be increased, but we don't need
  // more.
  if (exponent > 20) return false;
  if (fractional_count > 20) return false;
  *length = 0;
  // At most kDoubleSignificandSize bits of the significand are non-zero.
  // Given a 64 bit integer we have 11 0s followed by 53 potentially non-zero
  // bits:  0..11*..0xxx..53*..xx
  if (exponent + kDoubleSignificandSize > 64) {
    // The exponent must be > 11.
    //
    // We know that v = significand * 2^exponent.
    // And the exponent > 11.
    // We simplify the task by dividing v by 10^17.
    // The quotient delivers the first digits, and the remainder fits into a 64
    // bit number.
    // Dividing by 10^17 is equivalent to dividing by 5^17*2^17.
    const uint64_t kFive17 = DOUBLE_CONVERSION_UINT64_2PART_C(0xB1, A2BC2EC5);  // 5^17
    uint64_t divisor = kFive17;
    int divisor_power = 17;
    uint64_t dividend = significand;
    uint32_t quotient;
    uint64_t remainder;
    // Let v = f * 2^e with f == significand and e == exponent.
    // Then need q (quotient) and r (remainder) as follows:
    //   v            = q * 10^17       + r
    //   f * 2^e      = q * 10^17       + r
    //   f * 2^e      = q * 5^17 * 2^17 + r
    // If e > 17 then
    //   f * 2^(e-17) = q * 5^17        + r/2^17
    // else
    //   f  = q * 5^17 * 2^(17-e) + r/2^e
    if (exponent > divisor_power) {
      // We only allow exponents of up to 20 and therefore (17 - e) <= 3
      dividend <<= exponent - divisor_power;
      quotient = static_cast<uint32_t>(dividend / divisor);
      remainder = (dividend % divisor) << divisor_power;
    } else {
      divisor <<= divisor_power - exponent;
      quotient = static_cast<uint32_t>(dividend / divisor);
      remainder = (dividend % divisor) << exponent;
    }
    FillDigits32(quotient, buffer, length);
    FillDigits64FixedLength(remainder, buffer, length);
    *decimal_point = *length;
  } else if (exponent >= 0) {
    // 0 <= exponent <= 11
    significand <<= exponent;
    FillDigits64(significand, buffer, length);
    *decimal_point = *length;
  } else if (exponent > -kDoubleSignificandSize) {
    // We have to cut the number.
    uint64_t integrals = significand >> -exponent;
    uint64_t fractionals = significand - (integrals << -exponent);
    if (integrals > kMaxUInt32) {
      FillDigits64(integrals, buffer, length);
    } else {
      FillDigits32(static_cast<uint32_t>(integrals), buffer, length);
    }
    *decimal_point = *length;
    FillFractionals(fractionals, exponent, fractional_count,
                    buffer, length, decimal_point);
  } else if (exponent < -128) {
    // This configuration (with at most 20 digits) means that all digits must be
    // 0.
    DOUBLE_CONVERSION_ASSERT(fractional_count <= 20);
    buffer[0] = '\0';
    *length = 0;
    *decimal_point = -fractional_count;
  } else {
    *decimal_point = 0;
    FillFractionals(significand, exponent, fractional_count,
                    buffer, length, decimal_point);
  }
  TrimZeros(buffer, length, decimal_point);
  buffer[*length] = '\0';
  if ((*length) == 0) {
    // The string is empty and the decimal_point thus has no importance. Mimic
    // Gay's dtoa and set it to -fractional_count.
    *decimal_point = -fractional_count;
  }
  return true;
}